

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O0

void VHRotateV(double *px,double *py,double ox,double oy,double theta)

{
  double dVar1;
  double dVar2;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double tty;
  double ttx;
  double ty;
  double tx;
  
  dVar1 = *in_RDI;
  dVar2 = *in_RSI;
  dVar3 = cos(in_XMM2_Qa);
  dVar4 = sin(in_XMM2_Qa);
  dVar5 = sin(in_XMM2_Qa);
  dVar6 = cos(in_XMM2_Qa);
  *in_RDI = (dVar1 - in_XMM0_Qa) * dVar3 + -((dVar2 - in_XMM1_Qa) * dVar4) + in_XMM0_Qa;
  *in_RSI = (dVar1 - in_XMM0_Qa) * dVar5 + (dVar2 - in_XMM1_Qa) * dVar6 + in_XMM1_Qa;
  return;
}

Assistant:

void VHRotateV(double *px, double *py, double ox, double oy, double theta) {
	double tx, ty, ttx, tty;

	tx = *px - ox;
	ty = *py - oy;

	// With not a lot of parts on the boards, we can get away with using the
	// precision trig functions, might have to change to LUT based later.
	ttx = tx * cos(theta) - ty * sin(theta);
	tty = tx * sin(theta) + ty * cos(theta);

	*px = ttx + ox;
	*py = tty + oy;
}